

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonrpc_test.cpp
# Opt level: O0

void __thiscall json_service::compiles4v(json_service *this,value *f)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  runtime_error *this_00;
  ostringstream oss;
  string local_1b8 [48];
  ostringstream local_188 [392];
  
  iVar2 = cppcms::json::value::type();
  if (iVar2 == 5) {
    cppcms::json::value::object();
    bVar1 = std::
            map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
            ::empty((map<cppcms::string_key,_cppcms::json::value,_std::less<cppcms::string_key>,_std::allocator<std::pair<const_cppcms::string_key,_cppcms::json::value>_>_>
                     *)0x1207dd);
    if (bVar1) {
      return;
    }
  }
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar3 = std::operator<<((ostream *)local_188,"Error ");
  poVar3 = std::operator<<(poVar3,
                           "/workspace/llm4binary/github/license_c_cmakelists/artyom-beilis[P]cppcms/tests/jsonrpc_test.cpp"
                          );
  poVar3 = std::operator<<(poVar3,":");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,100);
  std::operator<<(poVar3," f.type()==cppcms::json::is_object && f.object().empty()");
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(this_00,local_1b8);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void compiles4v(cppcms::json::value f) {  TEST(f.type()==cppcms::json::is_object && f.object().empty()); }